

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O3

ostream * tchecker::dbm::output(ostream *os,db_t *db)

{
  uint uVar1;
  ostream *this;
  int iVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (*db == (db_t)0x7ffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<inf",4);
  }
  else {
    uVar1 = (uint)*db & 1;
    iVar2 = 0x1bb8c8;
    if (uVar1 == 0) {
      iVar2 = 0x1b2160;
    }
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,iVar2,uVar1 + iVar2 + 1);
    this = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_40,local_38);
    std::ostream::operator<<((ostream *)this,(int)*db >> 1);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::dbm::db_t const & db)
{
  if (db == tchecker::dbm::LT_INFINITY)
    os << "<inf";
  else
    os << tchecker::dbm::comparator_str(db) << tchecker::dbm::value(db);
  return os;
}